

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_decode_transport_parameter_list
              (quicly_transport_parameters_t *params,quicly_cid_t *original_dcid,
              quicly_cid_t *initial_scid,quicly_cid_t *retry_scid,void *stateless_reset_token,
              uint8_t *src,uint8_t *end,int recognize_delayed_ack)

{
  ptls_iovec_t src_00;
  ptls_iovec_t src_01;
  ptls_iovec_t src_02;
  uint8_t *end_00;
  uint64_t uVar1;
  quicly_cid_t *in_RCX;
  quicly_cid_t *in_RDX;
  quicly_cid_t *in_RSI;
  uint64_t *in_RDI;
  undefined8 *in_R8;
  uint8_t *in_R9;
  uint8_t *in_stack_00000008;
  int in_stack_00000010;
  uint64_t v_4;
  uint64_t v_3;
  uint64_t v_2;
  uint64_t v_1;
  uint64_t v;
  size_t cidl_2;
  size_t cidl_1;
  size_t cidl;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int tp_index;
  uint64_t id;
  int ret;
  uint64_t found_bits;
  uint8_t *in_stack_fffffffffffffef8;
  quicly_cid_t *in_stack_ffffffffffffff00;
  uint64_t local_e8;
  ulong local_c8;
  uint8_t *local_70;
  uint64_t local_68;
  uint64_t local_60;
  undefined8 local_58;
  int local_4c;
  uint64_t local_48;
  int local_3c;
  ulong local_38;
  uint8_t *local_30;
  undefined8 *local_28;
  quicly_cid_t *local_20;
  quicly_cid_t *local_18;
  quicly_cid_t *local_10;
  uint64_t *local_8;
  
  local_38 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(in_RDI,&default_transport_params,0x68);
  if ((local_10 != (quicly_cid_t *)0x0) && (local_10 != &_tp_cid_ignore)) {
    local_10->len = 0xff;
  }
  if ((local_18 != (quicly_cid_t *)0x0) && (local_18 != &_tp_cid_ignore)) {
    local_18->len = 0xff;
  }
  if ((local_20 != (quicly_cid_t *)0x0) && (local_20 != &_tp_cid_ignore)) {
    local_20->len = 0xff;
  }
  do {
    if (local_30 == in_stack_00000008) {
      if ((local_8[9] == 0xffffffffffffffff) ||
         (local_8[9] <= (ulong)(long)(int)((uint)*(ushort *)((long)local_8 + 0x42) * 1000))) {
        if ((((local_10 == (quicly_cid_t *)0x0) || (local_10->len != 0xff)) &&
            ((local_18 == (quicly_cid_t *)0x0 || (local_18->len != 0xff)))) &&
           ((local_20 == (quicly_cid_t *)0x0 || (local_20->len != 0xff)))) {
          local_3c = 0;
        }
        else {
          local_3c = 0x20008;
        }
      }
      else {
        local_3c = 0x2000a;
      }
      goto LAB_00133a60;
    }
    local_48 = ptls_decode_quicint(&local_30,in_stack_00000008);
    if (local_48 == 0xffffffffffffffff) {
      local_3c = 0x20008;
      goto LAB_00133a60;
    }
    local_4c = 0;
    local_58 = 0xffffffffffffffff;
    local_70 = local_30;
    local_68 = ptls_decode_quicint(&local_70,in_stack_00000008);
    if (local_68 == 0xffffffffffffffff) {
      local_3c = 0x32;
      goto LAB_00133a60;
    }
    local_30 = local_70;
    if ((ulong)((long)in_stack_00000008 - (long)local_70) < local_68) {
      local_3c = 0x32;
      goto LAB_00133a60;
    }
    end_00 = local_70 + local_68;
    local_60 = local_68;
    if (-1 < local_4c) {
      if (local_48 == 0) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        if (0x14 < (ulong)((long)end_00 - (long)local_70)) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_10 == (quicly_cid_t *)0x0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_10 != &_tp_cid_ignore) {
          ptls_iovec_init(local_70,(long)end_00 - (long)local_70);
          src_00.len = (size_t)in_stack_ffffffffffffff00;
          src_00.base = in_stack_fffffffffffffef8;
          quicly_set_cid((quicly_cid_t *)0x1329b6,src_00);
        }
        local_4c = -1;
        local_30 = end_00;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0xf) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        if (0x14 < (ulong)((long)end_00 - (long)local_30)) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_18 == (quicly_cid_t *)0x0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_18 != &_tp_cid_ignore) {
          ptls_iovec_init(local_30,(long)end_00 - (long)local_30);
          src_01.len = (size_t)in_stack_ffffffffffffff00;
          src_01.base = in_stack_fffffffffffffef8;
          quicly_set_cid((quicly_cid_t *)0x132af6,src_01);
        }
        local_4c = -1;
        local_30 = end_00;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0x10) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        if (0x14 < (ulong)((long)end_00 - (long)local_30)) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_20 == (quicly_cid_t *)0x0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_20 != &_tp_cid_ignore) {
          in_stack_ffffffffffffff00 = local_20;
          ptls_iovec_init(local_30,(long)end_00 - (long)local_30);
          src_02.len = (size_t)in_stack_ffffffffffffff00;
          src_02.base = in_stack_fffffffffffffef8;
          quicly_set_cid((quicly_cid_t *)0x132c36,src_02);
        }
        local_4c = -1;
        local_30 = end_00;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 3) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        local_c8 = ptls_decode_quicint(&local_30,end_00);
        if (local_c8 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (local_c8 < 0x4b0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (0xffff < local_c8) {
          local_c8 = 0xffff;
        }
        local_8[7] = local_c8 & 0xffff;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 5) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        *local_8 = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 6) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[1] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 7) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[2] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 4) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[3] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 2) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        if ((local_28 == (undefined8 *)0x0) || ((long)end_00 - (long)local_30 != 0x10)) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        *local_28 = *(undefined8 *)local_30;
        local_28[1] = *(undefined8 *)(local_30 + 8);
        local_4c = -1;
        local_30 = end_00;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 1) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[4] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 8) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[5] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 9) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[6] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 10) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (0x14 < uVar1) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        *(char *)(local_8 + 8) = (char)uVar1;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0xb) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (0x3fff < uVar1) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        *(short *)((long)local_8 + 0x42) = (short)uVar1;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if ((in_stack_00000010 != 0) && (-1 < local_4c)) {
      if (local_48 == 0xff02de1a) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        local_8[9] = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (0xffffff < local_8[9]) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0xe) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        uVar1 = ptls_decode_quicint(&local_30,end_00);
        if (uVar1 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (uVar1 < 2) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_8[0xb] = uVar1;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0xc) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        *(byte *)(local_8 + 10) = (byte)local_8[10] & 0xfe | 1;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      if (local_48 == 0x20) {
        if ((local_38 & 1L << ((byte)local_4c & 0x3f)) != 0) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        local_38 = 1L << ((byte)local_4c & 0x3f) | local_38;
        local_e8 = ptls_decode_quicint(&local_30,end_00);
        if (local_e8 == 0xffffffffffffffff) {
          local_3c = 0x20008;
          goto LAB_00133a60;
        }
        if (0xffff < local_e8) {
          local_e8 = 0xffff;
        }
        *(short *)(local_8 + 0xc) = (short)local_e8;
        local_4c = -1;
      }
      else {
        local_4c = local_4c + 1;
      }
    }
    if (-1 < local_4c) {
      local_30 = end_00;
    }
  } while (local_30 == end_00);
  local_3c = 0x32;
LAB_00133a60:
  if (local_3c == 0x32) {
    local_3c = 0x20008;
  }
  return local_3c;
}

Assistant:

int quicly_decode_transport_parameter_list(quicly_transport_parameters_t *params, quicly_cid_t *original_dcid,
                                           quicly_cid_t *initial_scid, quicly_cid_t *retry_scid, void *stateless_reset_token,
                                           const uint8_t *src, const uint8_t *end, int recognize_delayed_ack)
{
/* When non-negative, tp_index contains the literal position within the list of transport parameters recognized by this function.
 * That index is being used to find duplicates using a 64-bit bitmap (found_bits). When the transport parameter is being processed,
 * tp_index is set to -1. */
#define DECODE_TP(_id, block)                                                                                                      \
    do {                                                                                                                           \
        if (tp_index >= 0) {                                                                                                       \
            if (id == (_id)) {                                                                                                     \
                if ((found_bits & ((uint64_t)1 << tp_index)) != 0) {                                                               \
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                              \
                    goto Exit;                                                                                                     \
                }                                                                                                                  \
                found_bits |= (uint64_t)1 << tp_index;                                                                             \
                {block} tp_index = -1;                                                                                             \
            } else {                                                                                                               \
                ++tp_index;                                                                                                        \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)
#define DECODE_CID_TP(_id, dest)                                                                                                   \
    DECODE_TP(_id, {                                                                                                               \
        size_t cidl = end - src;                                                                                                   \
        if (cidl > QUICLY_MAX_CID_LEN_V1) {                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        }                                                                                                                          \
        if (dest == NULL) {                                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        } else if (dest != &tp_cid_ignore) {                                                                                       \
            quicly_set_cid(dest, ptls_iovec_init(src, cidl));                                                                      \
        }                                                                                                                          \
        src = end;                                                                                                                 \
    });

    uint64_t found_bits = 0;
    int ret;

    /* set parameters to their default values */
    *params = default_transport_params;

    /* Set optional parameters to UINT8_MAX. It is used to as a sentinel for detecting missing TPs. */
    if (original_dcid != NULL && original_dcid != &tp_cid_ignore)
        original_dcid->len = UINT8_MAX;
    if (initial_scid != NULL && initial_scid != &tp_cid_ignore)
        initial_scid->len = UINT8_MAX;
    if (retry_scid != NULL && retry_scid != &tp_cid_ignore)
        retry_scid->len = UINT8_MAX;

    /* decode the parameters block */
    while (src != end) {
        uint64_t id;
        if ((id = quicly_decodev(&src, end)) == UINT64_MAX) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
        int tp_index = 0;
        ptls_decode_open_block(src, end, -1, {
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_ORIGINAL_CONNECTION_ID, original_dcid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_SOURCE_CONNECTION_ID, initial_scid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_RETRY_SOURCE_CONNECTION_ID, retry_scid);
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_UDP_PAYLOAD_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < 1200) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_udp_payload_size = (uint16_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL, {
                if ((params->max_stream_data.bidi_local = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE, {
                if ((params->max_stream_data.bidi_remote = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI, {
                if ((params->max_stream_data.uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA, {
                if ((params->max_data = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_STATELESS_RESET_TOKEN, {
                if (!(stateless_reset_token != NULL && end - src == QUICLY_STATELESS_RESET_TOKEN_LEN)) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                memcpy(stateless_reset_token, src, QUICLY_STATELESS_RESET_TOKEN_LEN);
                src = end;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_IDLE_TIMEOUT, {
                if ((params->max_idle_timeout = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI, {
                if ((params->max_streams_bidi = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI, {
                if ((params->max_streams_uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACK_DELAY_EXPONENT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > 20) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->ack_delay_exponent = (uint8_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_ACK_DELAY, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v >= 16384) { /* "values of 2^14 or greater are invalid" */
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->max_ack_delay = (uint16_t)v;
            });
            /* min_ack_delay is recognized only if the support is enabled on this endpoint */
            if (recognize_delayed_ack) {
                DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MIN_ACK_DELAY, {
                    if ((params->min_ack_delay_usec = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                    if (params->min_ack_delay_usec >= 16777216) { /* "values of 2^24 or greater are invalid" */
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                });
            }
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < QUICLY_MIN_ACTIVE_CONNECTION_ID_LIMIT) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->active_connection_id_limit = v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_DISABLE_ACTIVE_MIGRATION, { params->disable_active_migration = 1; });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_DATAGRAM_FRAME_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_datagram_frame_size = (uint16_t)v;
            });
            /* skip unknown extension */
            if (tp_index >= 0)
                src = end;
        });
    }

    /* check consistency between the transpart parameters */
    if (params->min_ack_delay_usec != UINT64_MAX) {
        if (params->min_ack_delay_usec > params->max_ack_delay * 1000) {
            ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            goto Exit;
        }
    }

    /* check the absence of CIDs */
    if ((original_dcid != NULL && original_dcid->len == UINT8_MAX) || (initial_scid != NULL && initial_scid->len == UINT8_MAX) ||
        (retry_scid != NULL && retry_scid->len == UINT8_MAX)) {
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
        goto Exit;
    }

    ret = 0;
Exit:
    if (ret == PTLS_ALERT_DECODE_ERROR)
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
    return ret;

#undef DECODE_TP
#undef DECODE_CID_TP
}